

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFlow.c
# Opt level: O0

void Abc_NtkMaxFlowMinCutUpdate(Abc_Ntk_t *pNtk,Vec_Ptr_t *vMinCut,int fForward)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  int fForward_local;
  Vec_Ptr_t *vMinCut_local;
  Abc_Ntk_t *pNtk_local;
  
  for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,local_34);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffef;
    }
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,local_34);
    iVar1 = Abc_ObjIsLatch(pAVar3);
    if (iVar1 != 0) {
      pAVar3 = Abc_ObjFanout0(pAVar3);
      *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffef | 0x10;
    }
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(vMinCut), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vMinCut,local_34);
    Abc_NtkMaxFlowMarkCut_rec(pAVar3);
  }
  if (fForward == 0) {
    Vec_PtrClear(vMinCut);
    Abc_NtkIncrementTravId(pNtk);
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar3 = Abc_NtkBox(pNtk,local_34);
      iVar1 = Abc_ObjIsLatch(pAVar3);
      if (iVar1 != 0) {
        pAVar3 = Abc_ObjFanin0(pAVar3);
        Abc_NtkMaxFlowCollectCut_rec(pAVar3,vMinCut);
      }
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar3 = Abc_NtkObj(pNtk,local_34);
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        uVar2 = Abc_NodeIsTravIdCurrent(pAVar3);
        *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffef | (uVar2 & 1) << 4;
      }
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(vMinCut), local_34 < iVar1; local_34 = local_34 + 1) {
      pvVar5 = Vec_PtrEntry(vMinCut,local_34);
      *(uint *)((long)pvVar5 + 0x14) = *(uint *)((long)pvVar5 + 0x14) & 0xffffffef;
    }
  }
  else {
    Vec_PtrClear(vMinCut);
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar3 = Abc_NtkObj(pNtk,local_34);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 >> 4 & 1) != 0)) {
        for (local_38 = 0; iVar1 = Abc_ObjFanoutNum(pAVar3), local_38 < iVar1;
            local_38 = local_38 + 1) {
          pAVar4 = Abc_ObjFanout(pAVar3,local_38);
          if ((*(uint *)&pAVar4->field_0x14 >> 4 & 1) == 0) {
            Vec_PtrPush(vMinCut,pAVar3);
            break;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkMaxFlowMinCutUpdate( Abc_Ntk_t * pNtk, Vec_Ptr_t * vMinCut, int fForward )
{
    Abc_Obj_t * pObj, * pNext;
    int i, k;
    // clean marks
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->fMarkA = 0;
    // set latch outputs
    Abc_NtkForEachLatch( pNtk, pObj, i )
        Abc_ObjFanout0(pObj)->fMarkA = 1;
    // traverse from cut nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vMinCut, pObj, i )
        Abc_NtkMaxFlowMarkCut_rec( pObj );
    if ( fForward )
    {
        // change mincut to be nodes with unmarked fanouts
        Vec_PtrClear( vMinCut );
        Abc_NtkForEachObj( pNtk, pObj, i )
        {
            if ( !pObj->fMarkA )
                continue;
            Abc_ObjForEachFanout( pObj, pNext, k )
            {
                if ( pNext->fMarkA )
                    continue;
                Vec_PtrPush( vMinCut, pObj );
                break;
            }
        }
    }
    else
    {
        // change mincut to be marked fanins of the unmarked nodes
        Vec_PtrClear( vMinCut );
        Abc_NtkIncrementTravId(pNtk);
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_NtkMaxFlowCollectCut_rec( Abc_ObjFanin0(pObj), vMinCut );
        // transfer the attribute
        Abc_NtkForEachObj( pNtk, pObj, i )
            pObj->fMarkA = Abc_NodeIsTravIdCurrent(pObj);
        // unmark the cut nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vMinCut, pObj, i )
            pObj->fMarkA = 0;
    }
}